

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseNode.h
# Opt level: O2

JITJavascriptString * __thiscall CaseNode::GetUpperBoundStringConstLocal(CaseNode *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  StackSym *this_00;
  void *var;
  JITJavascriptString *pJVar4;
  
  bVar2 = IsUpperBoundStrConst(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/CaseNode.h"
                       ,0x34,"(IsUpperBoundStrConst())",
                       "Upper bound operand is not a string constant");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = IR::Opnd::GetStackSym((this->caseInstr->super_Instr).m_src2);
  var = StackSym::GetConstAddress(this_00,true);
  pJVar4 = JITJavascriptString::FromVar(var);
  return pJVar4;
}

Assistant:

JITJavascriptString* GetUpperBoundStringConstLocal()
    {
        AssertMsg(IsUpperBoundStrConst(), "Upper bound operand is not a string constant");
        return JITJavascriptString::FromVar(GetUpperBound()->GetStackSym()->GetConstAddress(true));
    }